

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatch.cpp
# Opt level: O3

cl_int clEnqueueAcquireExternalMemObjectsKHR
                 (cl_command_queue command_queue,cl_uint num_mem_objects,cl_mem *mem_objects,
                 cl_uint num_events_in_wait_list,cl_event *event_wait_list,cl_event *event)

{
  _Rb_tree_header *p_Var1;
  CTracker *pCVar2;
  CLIntercept *this;
  byte bVar3;
  cl_int errorCode;
  cl_int errorCode_00;
  int iVar4;
  mapped_type *pmVar5;
  time_point tVar6;
  time_point tVar7;
  _Base_ptr p_Var8;
  _Base_ptr p_Var9;
  cl_event *event_00;
  uint64_t uVar10;
  cl_platform_id platform;
  cl_device_id device;
  undefined1 local_98 [32];
  uint64_t local_78;
  cl_event *local_70;
  cl_command_queue local_68;
  time_point local_60;
  cl_uint local_54;
  time_point local_50;
  undefined8 local_48;
  cl_mem *local_40;
  cl_event local_38;
  
  this = g_pIntercept;
  if (g_pIntercept == (CLIntercept *)0x0) {
    return -0x24;
  }
  local_38 = (cl_event)0x0;
  local_70 = event;
  local_68 = command_queue;
  local_54 = num_mem_objects;
  local_40 = mem_objects;
  (*(g_pIntercept->m_Dispatch).clGetCommandQueueInfo)
            (command_queue,0x1091,8,&local_38,(size_t *)0x0);
  local_98._0_8_ = (key_type)0x0;
  (*(this->m_Dispatch).clGetDeviceInfo)((cl_device_id)local_38,0x1031,8,local_98,(size_t *)0x0);
  p_Var8 = (this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var8 == (_Base_ptr)0x0) {
LAB_00132f02:
    local_98._0_8_ = (key_type)0x0;
    pmVar5 = std::
             map<_cl_platform_id_*,_CLdispatchX,_std::less<_cl_platform_id_*>,_std::allocator<std::pair<_cl_platform_id_*const,_CLdispatchX>_>_>
             ::at(&this->m_DispatchX,(key_type *)local_98);
  }
  else {
    p_Var1 = &(this->m_DispatchX)._M_t._M_impl.super__Rb_tree_header;
    p_Var9 = &p_Var1->_M_header;
    do {
      if (*(key_type *)(p_Var8 + 1) >= (ulong)local_98._0_8_) {
        p_Var9 = p_Var8;
      }
      p_Var8 = (&p_Var8->_M_left)[*(key_type *)(p_Var8 + 1) < (ulong)local_98._0_8_];
    } while (p_Var8 != (_Base_ptr)0x0);
    p_Var8 = (_Base_ptr)0x0;
    if (((_Rb_tree_header *)p_Var9 == p_Var1) || ((ulong)local_98._0_8_ < *(key_type *)(p_Var9 + 1))
       ) goto LAB_00132f02;
    pmVar5 = (mapped_type *)&p_Var9[1]._M_parent;
  }
  if (pmVar5->clEnqueueAcquireExternalMemObjectsKHR ==
      (_func_cl_int_cl_command_queue_cl_uint_cl_mem_ptr_cl_uint_cl_event_ptr_cl_event_ptr *)0x0) {
    return -0x24;
  }
  local_78 = CLIntercept::incrementEnqueueCounter(this);
  if (((((this->m_Config).AubCapture == true) && ((this->m_Config).AubCaptureMinEnqueue <= local_78)
       ) && (local_78 <= (this->m_Config).AubCaptureMaxEnqueue)) &&
     ((this->m_Config).AubCaptureIndividualEnqueues == false)) {
    p_Var8 = (_Base_ptr)0x0;
    CLIntercept::startAubCapture
              (this,"clEnqueueAcquireExternalMemObjectsKHR",local_78,(cl_kernel)0x0,0,(size_t *)0x0,
               (size_t *)0x0,local_68);
  }
  errorCode_00 = 0;
  if ((this->m_Config).NullEnqueue != false) goto LAB_00132fa2;
  if ((this->m_Config).CallLogging == true) {
    p_Var8 = (_Base_ptr)0x0;
    CLIntercept::callLoggingEnter
              (this,"clEnqueueAcquireExternalMemObjectsKHR",local_78,(cl_kernel)0x0);
  }
  if ((this->m_Config).EventChecking == true) {
    p_Var8 = (_Base_ptr)event_wait_list;
    CLIntercept::checkEventList
              (this,"clEnqueueAcquireExternalMemObjectsKHR",num_events_in_wait_list,event_wait_list,
               local_70);
  }
  local_38 = (cl_event)0x0;
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     (((this->m_Config).ChromePerformanceTiming == false &&
      ((this->m_Config).DevicePerfCounterEventBasedSampling != true)))) {
    local_50.__d.__r = (duration)0;
    local_48 = 0;
  }
  else {
    local_50.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    local_48 = CONCAT71((int7)((ulong)p_Var8 >> 8),local_70 == (cl_event *)0x0);
    if (local_70 == (cl_event *)0x0) {
      local_70 = &local_38;
    }
  }
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    local_60.__d.__r = (duration)0;
  }
  else {
    local_60.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  }
  errorCode_00 = (*pmVar5->clEnqueueAcquireExternalMemObjectsKHR)
                           (local_68,local_54,local_40,num_events_in_wait_list,event_wait_list,
                            local_70);
  if (((this->m_Config).HostPerformanceTiming == false) &&
     ((this->m_Config).ChromeCallLogging != true)) {
    tVar6.__d.__r = (duration)0;
    event_00 = local_70;
    uVar10 = local_78;
  }
  else {
    tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    event_00 = local_70;
    uVar10 = local_78;
    if (((this->m_Config).HostPerformanceTiming == true) &&
       (((this->m_Config).HostPerformanceTimingMinEnqueue <= local_78 &&
        (local_78 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
      local_98._0_8_ = (key_type)(local_98 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
      CLIntercept::updateHostTimingStats
                (this,"clEnqueueAcquireExternalMemObjectsKHR",(string *)local_98,local_60,tVar6);
      if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
        operator_delete((void *)local_98._0_8_);
      }
    }
  }
  if ((((this->m_Config).DevicePerformanceTiming == false) &&
      ((this->m_Config).ITTPerformanceTiming == false)) &&
     ((this->m_Config).ChromePerformanceTiming == false)) {
    if ((event_00 != (cl_event *)0x0) &&
       ((this->m_Config).DevicePerfCounterEventBasedSampling != false)) {
LAB_0013345c:
      if (((this->m_Config).DevicePerformanceTimingMinEnqueue <= uVar10) &&
         (uVar10 <= (this->m_Config).DevicePerformanceTimingMaxEnqueue)) {
        if ((this->m_Config).DevicePerformanceTimingSkipUnmap == true) {
          local_98._0_8_ = local_98 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_98,"clEnqueueAcquireExternalMemObjectsKHR","");
          iVar4 = std::__cxx11::string::compare(local_98);
          if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
            operator_delete((void *)local_98._0_8_);
          }
          event_00 = local_70;
          if (iVar4 == 0) goto LAB_0013352c;
        }
        local_98._0_8_ = (key_type)(local_98 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
        CLIntercept::addTimingEvent
                  (this,"clEnqueueAcquireExternalMemObjectsKHR",uVar10,local_50,(string *)local_98,
                   local_68,*event_00);
        if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_);
        }
      }
LAB_0013352c:
      if ((char)local_48 != '\0') {
        (*(this->m_Dispatch).clReleaseEvent)(*event_00);
        goto LAB_0013353d;
      }
    }
  }
  else {
    if (event_00 != (cl_event *)0x0) goto LAB_0013345c;
LAB_0013353d:
    event_00 = (cl_event *)0x0;
  }
  if ((this->m_Config).ErrorLogging == false) {
    bVar3 = (this->m_Config).ErrorAssert;
    if ((bool)bVar3 == false) {
      if ((errorCode_00 == 0) || ((this->m_Config).NoErrors == false)) goto LAB_001335a3;
    }
    else if (errorCode_00 == 0) goto LAB_00133576;
LAB_00133588:
    if ((bVar3 & 1) != 0) {
      raise(5);
    }
    if ((this->m_Config).NoErrors != false) {
      errorCode_00 = 0;
    }
  }
  else {
    if (errorCode_00 != 0) {
      CLIntercept::logError(this,"clEnqueueAcquireExternalMemObjectsKHR",errorCode_00);
      bVar3 = (this->m_Config).ErrorAssert;
      goto LAB_00133588;
    }
LAB_00133576:
    errorCode_00 = 0;
  }
LAB_001335a3:
  if (((event_00 != (cl_event *)0x0) && ((this->m_Config).LeakChecking != false)) &&
     (*event_00 != (cl_event)0x0)) {
    LOCK();
    pCVar2 = &(this->m_ObjectTracker).m_Events;
    (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i =
         (pCVar2->NumAllocations).super___atomic_base<unsigned_long>._M_i + 1;
    UNLOCK();
  }
  if ((this->m_Config).CallLogging == true) {
    CLIntercept::callLoggingExit
              (this,"clEnqueueAcquireExternalMemObjectsKHR",errorCode_00,event_00,
               (cl_sync_point_khr *)0x0);
  }
  if ((this->m_Config).ChromeCallLogging == true) {
    local_98._0_8_ = (key_type)(local_98 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
    CLIntercept::chromeCallLoggingExit
              (this,"clEnqueueAcquireExternalMemObjectsKHR",(string *)local_98,true,uVar10,local_60,
               tVar6);
    if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
  }
  if (((event_00 != (cl_event *)0x0) && (*event_00 != (cl_event)0x0)) &&
     (((this->m_Config).ChromeCallLogging != false ||
      ((this->m_Config).ChromePerformanceTiming == true)))) {
    CLIntercept::addEvent(this,*event_00,uVar10);
  }
LAB_00132fa2:
  uVar10 = local_78;
  if ((this->m_Config).FinishAfterEnqueue == true) {
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::logFlushOrFinishAfterEnqueueStart
              (this,"clFinish","clEnqueueAcquireExternalMemObjectsKHR");
    errorCode = (*(this->m_Dispatch).clFinish)(local_68);
    CLIntercept::logFlushOrFinishAfterEnqueueEnd
              (this,"clFinish","clEnqueueAcquireExternalMemObjectsKHR",errorCode);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar10 &&
          (uVar10 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_98._0_8_ = (key_type)(local_98 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
        CLIntercept::updateHostTimingStats
                  (this,"(finish after enqueue)",(string *)local_98,tVar6,tVar7);
        if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_98._0_8_ = (key_type)(local_98 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(finish after enqueue)",(string *)local_98,false,0,tVar6,tVar7);
        if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_);
        }
      }
    }
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar6.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
    }
    else {
      tVar6.__d.__r = (duration)0;
    }
    CLIntercept::checkTimingEvents(this);
    if (((this->m_Config).ToolOverheadTiming == true) &&
       (((this->m_Config).HostPerformanceTiming != false ||
        ((this->m_Config).ChromeCallLogging == true)))) {
      tVar7.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
      if (((this->m_Config).HostPerformanceTiming == true) &&
         (((this->m_Config).HostPerformanceTimingMinEnqueue <= uVar10 &&
          (uVar10 <= (this->m_Config).HostPerformanceTimingMaxEnqueue)))) {
        local_98._0_8_ = (key_type)(local_98 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
        CLIntercept::updateHostTimingStats
                  (this,"(device timing overhead)",(string *)local_98,tVar6,tVar7);
        if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_);
        }
      }
      if ((this->m_Config).ChromeCallLogging == true) {
        local_98._0_8_ = (key_type)(local_98 + 0x10);
        std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"");
        CLIntercept::chromeCallLoggingExit
                  (this,"(device timing overhead)",(string *)local_98,false,0,tVar6,tVar7);
        if ((key_type)local_98._0_8_ != (key_type)(local_98 + 0x10)) {
          operator_delete((void *)local_98._0_8_);
        }
      }
    }
  }
  else if ((this->m_Config).FlushAfterEnqueue == true) {
    (*(this->m_Dispatch).clFlush)(local_68);
  }
  if (((this->m_Config).AubCapture == true) &&
     ((((this->m_Config).AubCaptureIndividualEnqueues != false ||
       (uVar10 < (this->m_Config).AubCaptureMinEnqueue)) ||
      ((this->m_Config).AubCaptureMaxEnqueue < uVar10)))) {
    CLIntercept::stopAubCapture(this,local_68);
  }
  return errorCode_00;
}

Assistant:

CL_API_ENTRY cl_int CL_API_CALL clEnqueueAcquireExternalMemObjectsKHR(
    cl_command_queue command_queue,
    cl_uint num_mem_objects,
    const cl_mem *mem_objects,
    cl_uint num_events_in_wait_list,
    const cl_event *event_wait_list,
    cl_event *event)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept )
    {
        const auto& dispatchX = pIntercept->dispatchX(command_queue);
        if( dispatchX.clEnqueueAcquireExternalMemObjectsKHR )
        {
            cl_int  retVal = CL_SUCCESS;

            INCREMENT_ENQUEUE_COUNTER();
            CHECK_AUBCAPTURE_START( command_queue );

            if( pIntercept->config().NullEnqueue == false )
            {
                CALL_LOGGING_ENTER();
                CHECK_EVENT_LIST( num_events_in_wait_list, event_wait_list, event );
                DEVICE_PERFORMANCE_TIMING_START( event );
                HOST_PERFORMANCE_TIMING_START();

                retVal = dispatchX.clEnqueueAcquireExternalMemObjectsKHR(
                    command_queue,
                    num_mem_objects,
                    mem_objects,
                    num_events_in_wait_list,
                    event_wait_list,
                    event);

                HOST_PERFORMANCE_TIMING_END();
                DEVICE_PERFORMANCE_TIMING_END( command_queue, event );
                CHECK_ERROR( retVal );
                ADD_OBJECT_ALLOCATION( event ? event[0] : NULL );
                CALL_LOGGING_EXIT_EVENT( retVal, event );
                ADD_EVENT( event ? event[0] : NULL );
            }

            FINISH_OR_FLUSH_AFTER_ENQUEUE( command_queue );
            CHECK_AUBCAPTURE_STOP( command_queue );

            return retVal;
        }
    }

    NULL_FUNCTION_POINTER_RETURN_ERROR(CL_INVALID_COMMAND_QUEUE);
}